

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O1

double mae(double *predicted,double *actual,int N)

{
  ulong uVar1;
  double dVar2;
  
  if (N < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + ABS(actual[uVar1] - predicted[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return dVar2 / (double)N;
}

Assistant:

double mae(double *predicted, double *actual, int N) {
    double err,temp,t;
    int i;

    temp = 0.0;

    for(i = 0; i < N;++i) {
        t = fabs(actual[i] - predicted[i]);
        temp += t;
    }

    err = temp / N;

    return err;
}